

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O1

Option * docopt::Option::parse(Option *__return_storage_ptr__,string *option_description)

{
  size_type *psVar1;
  undefined1 *puVar2;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  *this;
  regex_type **pprVar3;
  pointer pcVar4;
  Option *pOVar5;
  bool bVar6;
  int iVar7;
  size_type sVar8;
  pointer psVar9;
  long *plVar10;
  size_type *psVar11;
  pointer psVar12;
  long lVar13;
  string *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __b;
  undefined1 auStack_208 [8];
  smatch match;
  string local_1c0;
  string local_1a0;
  string *local_180;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  undefined1 local_170 [8];
  undefined1 local_168 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  string shortOption;
  char *local_120;
  undefined1 local_118;
  undefined7 uStack_117;
  match_flag_type mStack_110;
  undefined4 uStack_10c;
  Option *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  string longOption;
  sregex_iterator i;
  size_type *local_98;
  string m;
  value val;
  undefined1 local_40 [16];
  
  local_148 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&shortOption._M_string_length;
  shortOption._M_dataplus._M_p = (pointer)0x0;
  shortOption._M_string_length._0_1_ = 0;
  local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&longOption._M_string_length;
  longOption._M_dataplus._M_p = (pointer)0x0;
  longOption._M_string_length._0_1_ = 0;
  m.field_2._8_4_ = 1;
  val._0_8_ = val._0_8_ & 0xffffffffffffff00;
  sVar8 = std::__cxx11::string::find((char *)option_description,0x144e15,0);
  if (sVar8 == 0xffffffffffffffff) {
    sVar8 = option_description->_M_string_length;
  }
  __b._M_current = (option_description->_M_dataplus)._M_p + sVar8;
  if ((parse(std::__cxx11::string_const&)::pattern_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&)::pattern_abi_cxx11_),
     iVar7 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(std::__cxx11::string_const&)::pattern_abi_cxx11_,"(-{1,2})?(.*?)([,= ]|$)",
               0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(std::__cxx11::string_const&)::pattern_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(std::__cxx11::string_const&)::pattern_abi_cxx11_);
  }
  local_180 = option_description;
  local_178._M_current = __b._M_current;
  local_108 = __return_storage_ptr__;
  std::__cxx11::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                    *)((long)&longOption.field_2 + 8),
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(option_description->_M_dataplus)._M_p,__b,
                   &parse(std::__cxx11::string_const&)::pattern_abi_cxx11_,0x20);
  psVar1 = &m._M_string_length;
  match._M_begin._M_current = (char *)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_208 = (undefined1  [8])0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  i._M_match._M_begin._M_current = (char *)0x0;
  this = (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          *)((long)&longOption.field_2 + 8);
  while (bVar6 = std::__cxx11::
                 regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                 ::operator==(this,(regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                                    *)auStack_208), !bVar6) {
    if ((pointer)i._24_8_ ==
        i._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      bVar6 = false;
    }
    else {
      bVar6 = ((long)i._M_match.
                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - i._24_8_ >> 3) *
              -0x5555555555555555 - 5U < 0xfffffffffffffffe;
    }
    psVar12 = i._M_match.
              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + -3;
    psVar9 = (pointer)(i._24_8_ + 0x18);
    if (!bVar6) {
      psVar9 = psVar12;
    }
    lVar13 = (long)i._M_match.
                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - i._24_8_ >> 3;
    if (psVar9->matched == true) {
      psVar9 = psVar12;
      if (((pointer)i._24_8_ !=
           i._M_match.
           super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start) &&
         (psVar9 = (pointer)(i._24_8_ + 0x18),
         0xfffffffffffffffd < lVar13 * -0x5555555555555555 - 5U)) {
        psVar9 = psVar12;
      }
      if ((psVar9->matched == true) &&
         ((long)(psVar9->
                super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).second._M_current -
          (long)(psVar9->
                super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).first._M_current == 1)) {
        if ((pointer)i._24_8_ !=
            i._M_match.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start &&
            lVar13 * -0x5555555555555555 - 6U < 0xfffffffffffffffd) {
          psVar12 = (pointer)(i._24_8_ + 0x30);
        }
        if (psVar12->matched == true) {
          val.variant._24_8_ = local_40;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)((long)&val.variant + 0x18),
                     (psVar12->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar12->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          val.variant._24_8_ = local_40;
          local_40[0] = 0;
        }
        plVar10 = (long *)std::__cxx11::string::replace
                                    ((ulong)((long)&val.variant + 0x18),0,(char *)0x0,0x144e31);
        psVar11 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar11) {
          m._M_string_length = *psVar11;
          m.field_2._M_allocated_capacity = plVar10[3];
          local_98 = psVar1;
        }
        else {
          m._M_string_length = *psVar11;
          local_98 = (size_type *)*plVar10;
        }
        m._M_dataplus._M_p = (pointer)plVar10[1];
        *plVar10 = (long)psVar11;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        this_00 = (string *)&local_148;
      }
      else {
        if ((pointer)i._24_8_ !=
            i._M_match.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start &&
            lVar13 * -0x5555555555555555 - 6U < 0xfffffffffffffffd) {
          psVar12 = (pointer)(i._24_8_ + 0x30);
        }
        if (psVar12->matched == true) {
          val.variant._24_8_ = local_40;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)((long)&val.variant + 0x18),
                     (psVar12->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar12->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          val.variant._24_8_ = local_40;
          local_40[0] = 0;
        }
        plVar10 = (long *)std::__cxx11::string::replace
                                    ((ulong)((long)&val.variant + 0x18),0,(char *)0x0,0x144e30);
        psVar11 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar11) {
          m._M_string_length = *psVar11;
          m.field_2._M_allocated_capacity = plVar10[3];
          local_98 = psVar1;
        }
        else {
          m._M_string_length = *psVar11;
          local_98 = (size_type *)*plVar10;
        }
        m._M_dataplus._M_p = (pointer)plVar10[1];
        *plVar10 = (long)psVar11;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        this_00 = (string *)&local_100;
      }
      std::__cxx11::string::operator=(this_00,(string *)&local_98);
      if (local_98 != psVar1) {
        operator_delete(local_98);
      }
      if (val.variant._24_8_ != local_40) {
        operator_delete((void *)val.variant._24_8_);
      }
    }
    else {
      psVar9 = (pointer)(i._24_8_ + 0x30);
      if ((pointer)i._24_8_ ==
          i._M_match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ||
          0xfffffffffffffffc < lVar13 * -0x5555555555555555 - 6U) {
        psVar9 = psVar12;
      }
      if ((psVar9->matched == true) &&
         (0 < (long)(psVar9->
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).second._M_current -
              (long)(psVar9->
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).first._M_current)) {
        psVar9 = psVar12;
        if (((pointer)i._24_8_ !=
             i._M_match.
             super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) &&
           (psVar9 = (pointer)(i._24_8_ + 0x30),
           0xfffffffffffffffc < lVar13 * -0x5555555555555555 - 6U)) {
          psVar9 = psVar12;
        }
        if (psVar9->matched == true) {
          local_98 = psVar1;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_98,
                     (psVar9->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar9->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          m._M_dataplus._M_p = (pointer)0x0;
          m._M_string_length = m._M_string_length & 0xffffffffffffff00;
          local_98 = psVar1;
        }
        if (local_98 != psVar1) {
          operator_delete(local_98);
        }
        i._M_match._M_begin._M_current = (char *)0x1;
      }
    }
    if ((pointer)i._24_8_ ==
        i._M_match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      bVar6 = false;
    }
    else {
      bVar6 = ((long)i._M_match.
                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - i._24_8_ >> 3) *
              -0x5555555555555555 - 7U < 0xfffffffffffffffc;
    }
    if (bVar6) {
      psVar12 = (pointer)(i._24_8_ + 0x48);
    }
    else {
      psVar12 = i._M_match.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + -3;
    }
    if ((psVar12->matched != true) ||
       ((psVar12->
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).second._M_current ==
        (psVar12->
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).first._M_current)) break;
    std::__cxx11::
    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(this);
  }
  if (match._M_begin._M_current != (char *)0x0) {
    operator_delete(match._M_begin._M_current);
  }
  if (i._24_8_ != 0) {
    operator_delete((void *)i._24_8_);
  }
  if ((int)i._M_match._M_begin._M_current != 0) {
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    auStack_208 = (undefined1  [8])0x0;
    match.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pcVar4 = (local_180->_M_dataplus)._M_p;
    sVar8 = local_180->_M_string_length;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               ((long)&longOption.field_2 + 8),"\\[default: (.*)\\]",1);
    bVar6 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                      (local_178,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(pcVar4 + sVar8),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)auStack_208,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                       ((long)&longOption.field_2 + 8),0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               ((long)&longOption.field_2 + 8));
    if (bVar6) {
      if (auStack_208 ==
          (undefined1  [8])
          match.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        bVar6 = false;
      }
      else {
        bVar6 = ((long)match.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_208 >> 3) *
                -0x5555555555555555 - 5U < 0xfffffffffffffffe;
      }
      psVar12 = match.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + -3;
      if (bVar6) {
        psVar12 = (pointer)((long)auStack_208 + 0x18);
      }
      shortOption.field_2._8_8_ = &local_118;
      if (psVar12->matched == true) {
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)((long)&shortOption.field_2 + 8),
                   (psVar12->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (psVar12->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_120 = (char *)0x0;
        local_118 = 0;
      }
      pprVar3 = &i._M_pregex;
      longOption.field_2._8_4_ = 3;
      if ((undefined1 *)shortOption.field_2._8_8_ == &local_118) {
        i._M_flags = mStack_110;
        i._28_4_ = uStack_10c;
        i._M_begin._M_current = (char *)pprVar3;
      }
      else {
        i._M_begin._M_current = (char *)shortOption.field_2._8_8_;
      }
      i._M_pregex = (regex_type *)CONCAT71(uStack_117,local_118);
      i._M_end._M_current = local_120;
      local_118 = 0;
      if (m.field_2._8_4_ == 4) {
        shortOption.field_2._8_8_ = &local_118;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&val);
      }
      else {
        shortOption.field_2._8_8_ = &local_118;
        if ((m.field_2._8_4_ == 3) &&
           ((undefined1 *)val._0_8_ != (undefined1 *)((long)&val.variant + 8))) {
          operator_delete((void *)val._0_8_);
        }
      }
      m.field_2._8_4_ = longOption.field_2._8_4_;
      if (longOption.field_2._8_4_ - 1 < 4) {
        switch(longOption.field_2._8_4_) {
        case 1:
          val.kind._0_1_ = i._M_begin._M_current._0_1_;
          break;
        case 2:
          val._0_8_ = i._M_begin._M_current;
          break;
        case 3:
          val._0_8_ = (long)&val.variant + 8;
          if ((regex_type **)i._M_begin._M_current == pprVar3) {
            val.variant.strList.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)i._24_8_;
          }
          else {
            val._0_8_ = i._M_begin._M_current;
          }
          val.variant.strList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)i._M_pregex;
          val.variant.strValue._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)i._M_end._M_current;
          i._M_end._M_current = (char *)0x0;
          i._M_pregex = (regex_type *)((ulong)i._M_pregex & 0xffffffffffffff00);
          i._M_begin._M_current = (char *)pprVar3;
          break;
        case 4:
          val._0_8_ = i._M_begin._M_current;
          val.variant.strValue._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)i._M_end._M_current;
          val.variant.strList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)i._M_pregex;
          i._M_begin._M_current = (char *)0x0;
          i._M_end._M_current = (char *)0x0;
          i._M_pregex = (regex_type *)0x0;
        }
        if (longOption.field_2._8_4_ == 4) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&i);
        }
        else if ((longOption.field_2._8_4_ == 3) &&
                ((regex_type **)i._M_begin._M_current != pprVar3)) {
          operator_delete(i._M_begin._M_current);
        }
      }
      if ((undefined1 *)shortOption.field_2._8_8_ != &local_118) {
        operator_delete((void *)shortOption.field_2._8_8_);
      }
    }
    if (auStack_208 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_208);
    }
  }
  pOVar5 = local_108;
  psVar1 = &shortOption._M_string_length;
  if (local_148 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1c0.field_2._8_8_ = shortOption.field_2._M_allocated_capacity;
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  }
  else {
    local_1c0._M_dataplus._M_p = (pointer)local_148;
  }
  local_1c0.field_2._M_allocated_capacity._1_7_ = shortOption._M_string_length._1_7_;
  local_1c0.field_2._M_local_buf[0] = (undefined1)shortOption._M_string_length;
  psVar11 = &longOption._M_string_length;
  local_1c0._M_string_length = (size_type)shortOption._M_dataplus._M_p;
  shortOption._M_dataplus._M_p = (pointer)0x0;
  shortOption._M_string_length._0_1_ = 0;
  if (local_100 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_1a0.field_2._8_8_ = longOption.field_2._M_allocated_capacity;
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  }
  else {
    local_1a0._M_dataplus._M_p = (pointer)local_100;
  }
  local_1a0.field_2._M_allocated_capacity._1_7_ = longOption._M_string_length._1_7_;
  local_1a0.field_2._M_local_buf[0] = (undefined1)longOption._M_string_length;
  local_1a0._M_string_length = (size_type)longOption._M_dataplus._M_p;
  longOption._M_dataplus._M_p = (pointer)0x0;
  longOption._M_string_length._0_1_ = 0;
  local_170._0_4_ = m.field_2._8_4_;
  switch(m.field_2._8_4_) {
  case 1:
    local_168[0] = (undefined1)val.kind;
    break;
  case 2:
    local_168._0_8_ = val._0_8_;
    break;
  case 3:
    local_168._0_8_ = local_168 + 0x10;
    puVar2 = (undefined1 *)((long)&val.variant + 8);
    if ((undefined1 *)val._0_8_ == puVar2) {
      local_168._24_8_ =
           val.variant.strList.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      local_168._0_8_ = val._0_8_;
    }
    local_168._16_8_ = val.variant.strValue._M_string_length;
    local_168._8_8_ = val.variant.longValue;
    val.variant.longValue = 0;
    val.variant.strValue._M_string_length =
         val.variant.strValue._M_string_length & 0xffffffffffffff00;
    val._0_8_ = puVar2;
    break;
  case 4:
    local_168._0_8_ = val._0_8_;
    local_168._8_8_ = val.variant.longValue;
    local_168._16_8_ = val.variant.strValue._M_string_length;
    val.kind = Empty;
    val._4_4_ = 0;
    val.variant.longValue = 0;
    val.variant.strValue._M_string_length = 0;
  }
  local_148 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1;
  local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11;
  Option(local_108,&local_1c0,&local_1a0,(int)i._M_match._M_begin._M_current,(value *)local_170);
  if (local_170._0_4_ == StringList) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_168);
  }
  else if ((local_170._0_4_ == String) && ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)))
  {
    operator_delete((void *)local_168._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if (m.field_2._8_4_ == 4) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&val);
  }
  else if ((m.field_2._8_4_ == 3) &&
          ((undefined1 *)val._0_8_ != (undefined1 *)((long)&val.variant + 8))) {
    operator_delete((void *)val._0_8_);
  }
  if (local_100 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    operator_delete(local_100);
  }
  if (local_148 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    operator_delete(local_148);
  }
  return pOVar5;
}

Assistant:

inline Option Option::parse(std::string const& option_description)
	{
		std::string shortOption, longOption;
		int argcount = 0;
		value val { false };

		auto double_space = option_description.find("  ");
		auto options_end = option_description.end();
		if (double_space != std::string::npos) {
			options_end = option_description.begin() + static_cast<std::ptrdiff_t>(double_space);
		}

		static const std::regex pattern {"(-{1,2})?(.*?)([,= ]|$)"};
		for(std::sregex_iterator i {option_description.begin(), options_end, pattern, std::regex_constants::match_not_null},
			   e{};
			i != e;
			++i)
		{
			std::smatch const& match = *i;
			if (match[1].matched) { // [1] is optional.
				if (match[1].length()==1) {
						shortOption = "-" + match[2].str();
				} else {
						longOption =  "--" + match[2].str();
				}
			} else if (match[2].length() > 0) { // [2] always matches.
				std::string m = match[2];
				argcount = 1;
			} else {
				// delimeter
			}

			if (match[3].length() == 0) { // [3] always matches.
				// Hit end of string. For some reason 'match_not_null' will let us match empty
				// at the end, and then we'll spin in an infinite loop. So, if we hit an empty
				// match, we know we must be at the end.
				break;
			}
		}

		if (argcount) {
			std::smatch match;
			if (std::regex_search(options_end, option_description.end(),
						  match,
						  std::regex{"\\[default: (.*)\\]", std::regex::icase}))
			{
				val = match[1].str();
			}
		}

		return {std::move(shortOption),
			std::move(longOption),
			argcount,
			std::move(val)};
	}